

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdespacket.h
# Opt level: O2

bool __thiscall jrtplib::RTCPSDESPacket::GotoNextItem(RTCPSDESPacket *this)

{
  uint8_t *puVar1;
  size_t sVar2;
  
  if (((((this->super_RTCPPacket).knownformat == true) &&
       (puVar1 = this->currentchunk, puVar1 != (uint8_t *)0x0)) &&
      (sVar2 = this->itemoffset, puVar1[sVar2] != '\0')) &&
     (puVar1[sVar2 + puVar1[sVar2 + 1] + 2] != '\0')) {
    this->itemoffset = sVar2 + puVar1[sVar2 + 1] + 2;
    return true;
  }
  return false;
}

Assistant:

inline bool RTCPSDESPacket::GotoNextItem()
{
	if (!knownformat)
		return false;
	if (currentchunk == 0)
		return false;
	
	RTCPSDESHeader *sdeshdr = (RTCPSDESHeader *)(currentchunk+itemoffset);
	if (sdeshdr->sdesid == 0)
		return false;
	
	size_t offset = itemoffset;
	offset += sizeof(RTCPSDESHeader);
	offset += (size_t)(sdeshdr->length);
	sdeshdr = (RTCPSDESHeader *)(currentchunk+offset);
	if (sdeshdr->sdesid == 0)
		return false;
	itemoffset = offset;
	return true;
}